

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict type_name(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  parse_ctx *ppVar2;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  node_t_conflict op2;
  pos_t p;
  
  ppVar2 = c2m_ctx->parse_ctx;
  pnVar3 = spec_qual_list(c2m_ctx,no_err_p);
  if (pnVar3 == &err_struct) {
    return &err_struct;
  }
  sVar1 = *(short *)ppVar2->curr_token;
  if ((sVar1 == 0x29) || (sVar1 == 0x3a)) {
    p = get_node_pos(c2m_ctx,pnVar3);
    pnVar4 = new_node(c2m_ctx,N_IGNORE);
    op2 = new_node(c2m_ctx,N_LIST);
    pnVar4 = new_node2(c2m_ctx,N_DECL,pnVar4,op2);
    add_pos(c2m_ctx,pnVar4,p);
  }
  else {
    pnVar4 = abstract_declarator(c2m_ctx,no_err_p);
    if (pnVar4 == &err_struct) {
      return &err_struct;
    }
  }
  pnVar3 = new_node2(c2m_ctx,N_TYPE,pnVar3,pnVar4);
  return pnVar3;
}

Assistant:

D (type_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op, r;

  P (spec_qual_list);
  op = r;
  if (!C (')') && !C (':')) {
    P (abstract_declarator);
  } else {
    r = new_pos_node2 (c2m_ctx, N_DECL, POS (op), new_node (c2m_ctx, N_IGNORE),
                       new_node (c2m_ctx, N_LIST));
  }
  return new_node2 (c2m_ctx, N_TYPE, op, r);
}